

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

void __thiscall libDAI::NDP::EliminateVariable(NDP *this,size_t i_th_var)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  void *pvVar4;
  const_reference pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  double *pdVar10;
  size_type sVar11;
  reference pvVar12;
  ulong in_RSI;
  long *in_RDI;
  iterator pos;
  size_t fI_2;
  size_t j;
  size_t gI;
  nb_type *nb_vI;
  size_t vI;
  size_t i_3;
  size_t i_2;
  size_t brI;
  double val;
  stringstream ss;
  Factor sliced_Fi;
  Index *index_i;
  VarSet *vs_i;
  Factor *f;
  size_t fI_1;
  size_t i_1;
  Factor contribution_vec_v;
  size_t jI;
  VarSet vs_F;
  Factor *F;
  size_t fI;
  size_t i;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> vs_vec;
  vector<libDAI::Index,_std::allocator<libDAI::Index>_> index_vec;
  Factor *newFactor;
  size_t num_Vs;
  VarSet neighVs;
  nb_type neighVIs2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighVIs2_1;
  size_t num_Fs;
  nb_type *neighFIs;
  Var *v;
  FactorGraph *g;
  size_t varIndex;
  Index *in_stack_fffffffffffff888;
  NDP *in_stack_fffffffffffff890;
  NDP *in_stack_fffffffffffff898;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffff8a0;
  const_iterator in_stack_fffffffffffff8a8;
  Index *in_stack_fffffffffffff8b0;
  Var *in_stack_fffffffffffff8b8;
  VarSet *in_stack_fffffffffffff8c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff8d8;
  VarSet *in_stack_fffffffffffff8e0;
  NDP *in_stack_fffffffffffff8e8;
  ulong uVar13;
  NDP *in_stack_fffffffffffff8f0;
  VarSet *in_stack_fffffffffffff960;
  VarSet *in_stack_fffffffffffff968;
  Index *in_stack_fffffffffffff970;
  size_t in_stack_fffffffffffff980;
  value_type vVar14;
  NDP *in_stack_fffffffffffff988;
  size_t in_stack_fffffffffffff9a8;
  VarSet *in_stack_fffffffffffff9b0;
  TFactor<double> *in_stack_fffffffffffff9b8;
  nb_type *in_stack_fffffffffffffa78;
  ulong local_4e0;
  ulong local_4c0;
  value_type local_4b8;
  value_type local_4b0;
  double local_4a8;
  stringstream local_478 [16];
  ostream local_468 [432];
  reference local_2b8;
  reference local_2b0;
  Factor *local_2a8;
  value_type local_2a0;
  ulong local_298;
  ulong local_238;
  Factor *local_1c0;
  value_type local_1b8;
  ulong local_1b0;
  reference local_168;
  string local_110 [56];
  string local_d8 [32];
  size_type local_b8;
  VarSet local_b0 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68 [2];
  size_type local_38;
  nb_type *local_30;
  Var *local_28;
  long *local_20;
  value_type local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  if (in_RDI[0x23] != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Starting elimination of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2,"-th var...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
  local_18 = *pvVar3;
  local_20 = (long *)(**(code **)(*in_RDI + 0x20))();
  local_28 = (Var *)(**(code **)(*local_20 + 0x30))(local_20,local_18);
  local_30 = GetNeighsV(in_stack_fffffffffffff890,(size_t)in_stack_fffffffffffff888);
  local_38 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
  if (in_RDI[0x23] != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbb66a1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffff8a0._M_current);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbb66bb);
  GetVNeighsV(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffff8a0._M_current,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff898);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffff8a0._M_current);
  VarSetFromNB(in_stack_fffffffffffff8e8,(nb_type *)in_stack_fffffffffffff8e0);
  local_b8 = VarSet::size((VarSet *)0xbb6738);
  if (1 < (ulong)in_RDI[0x23]) {
    poVar2 = std::operator<<((ostream *)&std::cout,"it praticipates in ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
    std::operator<<(poVar2," factors");
    if (2 < (ulong)in_RDI[0x23]) {
      poVar2 = std::operator<<((ostream *)&std::cout,": ");
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8e0,
                 in_stack_fffffffffffff8d8);
      printNB_abi_cxx11_(in_stack_fffffffffffffa78);
      std::operator<<(poVar2,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff8a0._M_current);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"it has ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b8);
    std::operator<<(poVar2," variables neighbors");
    if (2 < (ulong)in_RDI[0x23]) {
      poVar2 = std::operator<<((ostream *)&std::cout,": ");
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8e0,
                 in_stack_fffffffffffff8d8);
      printNB_abi_cxx11_(in_stack_fffffffffffffa78);
      std::operator<<(poVar2,local_110);
      std::__cxx11::string::~string(local_110);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff8a0._M_current);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  if (((ulong)in_RDI[0x24] < local_b8) && (in_RDI[0x24] = local_b8, in_RDI[0x23] != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Induced width increased to ");
    pvVar4 = (void *)std::ostream::operator<<(poVar2,in_RDI[0x24]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  TFactor<double>::TFactor
            ((TFactor<double> *)in_stack_fffffffffffff8b0,
             (VarSet *)in_stack_fffffffffffff8a8._M_current);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
  TFactor<double>::operator=
            ((TFactor<double> *)in_stack_fffffffffffff890,
             (TFactor<double> *)in_stack_fffffffffffff888);
  TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff890);
  local_168 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                        ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          *)in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
  SetNeighF(in_stack_fffffffffffff8f0,(size_t)in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
  TFactor<double>::stateSpace((TFactor<double> *)0xbb6ba4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8b0,
             (size_type)in_stack_fffffffffffff8a8._M_current);
  std::allocator<libDAI::Index>::allocator((allocator<libDAI::Index> *)0xbb6bea);
  std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::vector
            ((vector<libDAI::Index,_std::allocator<libDAI::Index>_> *)in_stack_fffffffffffff8b0,
             (size_type)in_stack_fffffffffffff8a8._M_current,
             (allocator_type *)in_stack_fffffffffffff8a0._M_current);
  std::allocator<libDAI::Index>::~allocator((allocator<libDAI::Index> *)0xbb6c16);
  std::allocator<libDAI::VarSet>::allocator((allocator<libDAI::VarSet> *)0xbb6c3b);
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
            ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_fffffffffffff8b0,
             (size_type)in_stack_fffffffffffff8a8._M_current,
             (allocator_type *)in_stack_fffffffffffff8a0._M_current);
  std::allocator<libDAI::VarSet>::~allocator((allocator<libDAI::VarSet> *)0xbb6c67);
  for (local_1b0 = 0; local_1b0 < local_38; local_1b0 = local_1b0 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
    local_1b8 = *pvVar5;
    local_1c0 = GetFactor(in_stack_fffffffffffff898,(size_t)in_stack_fffffffffffff890);
    TFactor<double>::vars(local_1c0);
    VarSet::VarSet((VarSet *)in_stack_fffffffffffff890,(VarSet *)in_stack_fffffffffffff888);
    VarSet::operator/=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::at
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)in_stack_fffffffffffff890,
               (size_type)in_stack_fffffffffffff888);
    VarSet::operator=((VarSet *)in_stack_fffffffffffff890,(VarSet *)in_stack_fffffffffffff888);
    Index::Index(in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::at
              ((vector<libDAI::Index,_std::allocator<libDAI::Index>_> *)in_stack_fffffffffffff890,
               (size_type)in_stack_fffffffffffff888);
    Index::operator=((Index *)in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    Index::~Index((Index *)in_stack_fffffffffffff890);
    VarSet::~VarSet((VarSet *)0xbb6dd4);
  }
  local_238 = 0;
  while( true ) {
    uVar13 = local_238;
    sVar6 = VarSet::stateSpace(local_b0);
    if (sVar6 <= uVar13) {
      if (6 < (ulong)in_RDI[0x23]) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "New factor (and best-responses) computed, updating neighbors...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      local_4c0 = 0;
      while (uVar13 = local_4c0,
            sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_68),
            uVar13 < sVar11) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
        pvVar12 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
        ToGlobalFactorIndex((NDP *)in_stack_fffffffffffff8a0._M_current,
                            (size_t)in_stack_fffffffffffff898);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff8a0._M_current,
                   (value_type_conflict2 *)in_stack_fffffffffffff898);
        for (local_4e0 = 0;
            sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30),
            local_4e0 < sVar11; local_4e0 = local_4e0 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff888);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff888);
          std::
          find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )in_stack_fffffffffffff8a8._M_current,in_stack_fffffffffffff8a0,
                     (unsigned_long *)in_stack_fffffffffffff898);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffff888);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff890,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff888);
          if (bVar1) {
            in_stack_fffffffffffff8a8._M_current = (unsigned_long *)pvVar12;
            __gnu_cxx::
            __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ::__normal_iterator<unsigned_long*>
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff890,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffff888);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff8a0._M_current,in_stack_fffffffffffff8a8);
          }
        }
        local_4c0 = local_4c0 + 1;
      }
      if (1 < (ulong)in_RDI[0x23]) {
        in_stack_fffffffffffff8a0._M_current =
             (unsigned_long *)std::ostream::operator<<(&std::cout,local_10);
        poVar2 = std::operator<<((ostream *)in_stack_fffffffffffff8a0._M_current,
                                 "-th variable (varIndex=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
        poVar2 = std::operator<<(poVar2,") has been eliminated");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
                ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                 in_stack_fffffffffffff8a0._M_current);
      std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::~vector
                ((vector<libDAI::Index,_std::allocator<libDAI::Index>_> *)
                 in_stack_fffffffffffff8a0._M_current);
      VarSet::~VarSet((VarSet *)0xbb79a5);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffff8a0._M_current);
      return;
    }
    VarSet::VarSet((VarSet *)in_stack_fffffffffffff8a0._M_current,(Var *)in_stack_fffffffffffff898);
    TFactor<double>::TFactor
              ((TFactor<double> *)in_stack_fffffffffffff8b0,
               (VarSet *)in_stack_fffffffffffff8a8._M_current,
               (Real)in_stack_fffffffffffff8a0._M_current);
    VarSet::~VarSet((VarSet *)0xbb6f4c);
    for (local_298 = 0; local_298 < local_38; local_298 = local_298 + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
      local_2a0 = *pvVar5;
      local_2a8 = GetFactor(in_stack_fffffffffffff898,(size_t)in_stack_fffffffffffff890);
      local_2b0 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::at
                            ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)
                             in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
      local_2b8 = std::vector<libDAI::Index,_std::allocator<libDAI::Index>_>::at
                            ((vector<libDAI::Index,_std::allocator<libDAI::Index>_> *)
                             in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
      Index::operator_cast_to_long(local_2b8);
      TFactor<double>::slice
                (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      TFactor<double>::operator+=
                ((TFactor<double> *)in_stack_fffffffffffff890,
                 (TFactor<double> *)in_stack_fffffffffffff888);
      Index::operator++(in_stack_fffffffffffff8b0);
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff890);
    }
    sVar6 = TFactor<double>::stateSpace((TFactor<double> *)0xbb7149);
    sVar7 = Var::states(local_28);
    if (sVar6 != sVar7) break;
    local_4a8 = -1.79769313486232e+308;
    local_4b0 = 0;
    local_4b8 = 0;
    while (vVar14 = local_4b8, sVar6 = Var::states(local_28), vVar14 < sVar6) {
      pdVar10 = TFactor<double>::operator[]
                          ((TFactor<double> *)in_stack_fffffffffffff890,
                           (size_t)in_stack_fffffffffffff888);
      if (local_4a8 < *pdVar10) {
        pdVar10 = TFactor<double>::operator[]
                            ((TFactor<double> *)in_stack_fffffffffffff890,
                             (size_t)in_stack_fffffffffffff888);
        local_4a8 = *pdVar10;
        local_4b0 = local_4b8;
      }
      local_4b8 = local_4b8 + 1;
    }
    pdVar10 = TFactor<double>::operator[]
                        ((TFactor<double> *)in_stack_fffffffffffff890,
                         (size_t)in_stack_fffffffffffff888);
    *pdVar10 = local_4a8;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
    *pvVar3 = local_4b0;
    if (3 < (ulong)in_RDI[0x23]) {
      poVar2 = std::operator<<((ostream *)&std::cout,"best-response for ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_238);
      poVar2 = std::operator<<(poVar2,"-th \'local state\' is ");
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::at((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffff890,(size_type)in_stack_fffffffffffff888);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
      poVar2 = std::operator<<(poVar2," (value = ");
      pdVar10 = TFactor<double>::operator[]
                          ((TFactor<double> *)in_stack_fffffffffffff890,
                           (size_t)in_stack_fffffffffffff888);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar10);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff890);
    local_238 = local_238 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_478);
  poVar2 = std::operator<<(local_468,"contribution_vec_v.stateSpace() = ");
  sVar6 = TFactor<double>::stateSpace((TFactor<double> *)0xbb71bd);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar6);
  poVar2 = std::operator<<(poVar2," != v.states() = ");
  sVar6 = Var::states(local_28);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar6);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  std::__cxx11::stringstream::str();
  uVar9 = std::__cxx11::string::c_str();
  *puVar8 = uVar9;
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

void NDP::EliminateVariable(size_t i_th_var)
    {
        if(Props.verbose >= 1)
            cout << "Starting elimination of "<<i_th_var<<"-th var..."<<endl;

        size_t varIndex = _m_varOrder.at(i_th_var);
        const FactorGraph& g = grm();

        //this has been replaced by the GetFactor function that 
        //generalizes to refer to *all* (orig+ new) factors
        //const std::vector < Factor > & 	facs = g.factors();

        //get ref the the variable 
        const Var & v = g.var(varIndex);

        //get all the factors of the var - use the local 'GetNeighsV' function!
        //(since that include newly constructed factors, and only factors
        //that are still in consideration)
        const FactorGraph::nb_type &  neighFIs = GetNeighsV(varIndex);
        size_t num_Fs = neighFIs.size();
            if(Props.verbose >= 1)

        vector<size_t> neighVIs2;

        //get all the (indices of) neighbors of those, the 'neighVIs2' 
        //!??!? I used 'neighVIs' but that gave compiler errors?!?
        nb_type neighVIs2;
        //cout << printNB(neighVIs2);
        neighVIs2 = GetVNeighsV(varIndex);
        //get all the neighbors of those, the 'neighVs' 
        VarSet neighVs = VarSetFromNB(neighVIs2);
        size_t num_Vs = neighVs.size();
        if(Props.verbose >= 2)
        {
            cout << "it praticipates in "<<num_Fs << " factors";
            if(Props.verbose >= 3)
                cout << ": "<< printNB(neighFIs);
            cout <<endl;
            cout << "it has "<<num_Vs << " variables neighbors";
            if(Props.verbose >= 3)
                cout << ": "<< printNB(neighVIs2);
            cout <<endl;
        }
        if(num_Vs > _m_induced_width)
        {
            _m_induced_width = num_Vs;
            if(Props.verbose >= 1)
                cout << "Induced width increased to "<<_m_induced_width<<endl;
        }

        //the new factor will include all these neighVs:
        _m_newFacs.at(i_th_var) = Factor(neighVs);
        Factor& newFactor = _m_newFacs.at(i_th_var);
        SetNeighF(i_th_var, neighVs);

        //and we will need to keep track of the best-responses
        //of this variable v
        _m_bestResps.at(i_th_var).resize( newFactor.stateSpace() );

        //loop over all states of neighVs, compute v's best response
        //and store as a new factor.
        
        //make an index(vs_F, neighVs) for each factor F in neighFs
        vector< Index > index_vec(num_Fs);
        vector< VarSet > vs_vec(num_Fs);
        for(size_t i=0; i < num_Fs; i++)
        {
            size_t fI = neighFIs.at(i);
            const Factor& F = GetFactor( fI );
            VarSet vs_F = F.vars();
            //remove variable varIndex:
            vs_F /= v;
            vs_vec.at(i) = vs_F;
            index_vec.at(i) = Index(vs_F, neighVs);
        }
        for( size_t jI=0; jI < neighVs.stateSpace(); jI++)
        {//compute best response against joint state jI.
            //here we will store the amount that v can achieve by
            //selecting each of its states when neighVs have state jI:
            Factor contribution_vec_v(v, 0.0);

            //loop over all neighFs
            //-get the slice that corresponds to the assignment of 'states'
            // according to jI (this should be a vector of v's states)
            //-add to contribution_vec_v 
            for(size_t i=0; i < num_Fs; i++)
            {
                //process the i-th neighboring factor, corresponding to 
                size_t fI = neighFIs.at(i);
                const Factor& f = GetFactor( fI );
                VarSet & vs_i = vs_vec.at(i);
                Index & index_i = index_vec.at(i);
                Factor sliced_Fi = f.slice( vs_i, index_i);
                //sliced_Fi should be a factor depending only on v now...
                //and thus we add it to the contribution_vec_v
                contribution_vec_v += sliced_Fi;
                
                //update its index:
                ++index_i;
            }

            //sanity check:
            if( contribution_vec_v.stateSpace() != v.states() )
            {
                stringstream ss;
                ss << "contribution_vec_v.stateSpace() = "<<
                   contribution_vec_v.stateSpace() <<
                   " != v.states() = "<< 
                   v.states() << endl;

                throw ( ss.str().c_str() );
            }

            //now the state of v that has the highest value in 
            //contribution_vec_v is the best response:
            double val = -DBL_MAX;
            size_t brI = 0;
            for(size_t i=0; i < v.states() ; i++)
                if( contribution_vec_v[i] > val)
                {
                    val = contribution_vec_v[i];
                    brI = i;
                }
            
            newFactor[jI] = val;
            _m_bestResps.at(i_th_var).at(jI) = brI;

            if(Props.verbose >= 4)
                cout << "best-response for "<<jI<<"-th 'local state' is "<<
                    _m_bestResps.at(i_th_var).at(jI) << " (value = "<<
                    newFactor[jI] <<")"<<endl;

        }
        if(Props.verbose >= 7)
            cout << "New factor (and best-responses) computed, updating neighbors..."<<
               endl; 

        //update: _m_neighV
        //-> the factors with indices 'neighFIs' have been removed
        //-> these factors have been replaced by 
        //      'newFactor = _m_newFacs.at(i_th_var)'
        //   whose global index is given by 
        //      gI = ToGlobalFactorIndex(i_th_var)
        //
        //-> the variables in Varset  'neighVs'  are affected by that
        //      - remove old factor indices
        //      - add gI
        
        for(size_t i=0; i < neighVIs2.size(); i++)
        {
            size_t vI = neighVIs2.at(i);
            nb_type & nb_vI = _m_neighV.at(vI);
            
            //add new factor to nb_vI
            size_t gI = ToGlobalFactorIndex(i_th_var);
            nb_vI.push_back(gI);

            //remove indices from neighFIs
            for(size_t j=0; j<neighFIs.size(); j++)
            {
                size_t fI = neighFIs.at(j);
                //check if fI in nb_vI
                //     std::find(vector.begin(), vector.end(), item)!=vector.end()
                nb_type::iterator pos = std::find(
                        nb_vI.begin(),
                        nb_vI.end(),
                        fI);
                //i guess it will do not harm if pos==end() ?
                //nb_vI.erase(pos);
                //well the segfault indicates otherwise:
                if(pos != nb_vI.end())
                    nb_vI.erase(pos);
            }
        }

        //update _m_neighF
        //-> remove this agent from any neighborhood
        //-> but is not necessary... all its factors have been removed!

        if(Props.verbose >= 2)
            cout << i_th_var<<"-th variable (varIndex="<<varIndex<<
                ") has been eliminated"<<endl;

    }